

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264d_vdpu34x.c
# Opt level: O3

MPP_RET vdpu34x_h264d_deinit(void *hal)

{
  int iVar1;
  long lVar2;
  MppBuffer buffer;
  undefined8 *puVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar2 = *(long *)((long)hal + 0x90);
  iVar1 = *(int *)((long)hal + 0x98);
  mpp_buffer_put_with_caller(*(MppBuffer *)(lVar2 + 0x310),"vdpu34x_h264d_deinit");
  puVar3 = (undefined8 *)(lVar2 + 0x360);
  uVar4 = 0;
  do {
    if ((void *)*puVar3 != (void *)0x0) {
      mpp_osal_free("vdpu34x_h264d_deinit",(void *)*puVar3);
    }
    *puVar3 = 0;
    if (iVar1 == 0) break;
    puVar3 = puVar3 + 2;
    bVar5 = uVar4 < 2;
    uVar4 = uVar4 + 1;
  } while (bVar5);
  iVar1 = *(int *)((long)hal + 0x98);
  uVar4 = 0;
  do {
    buffer = *(MppBuffer *)(lVar2 + 0x428 + uVar4 * 8);
    if (buffer != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(buffer,"vdpu34x_h264d_deinit");
      *(undefined8 *)(lVar2 + 0x428 + uVar4 * 8) = 0;
    }
  } while ((iVar1 != 0) && (bVar5 = uVar4 < 2, uVar4 = uVar4 + 1, bVar5));
  if (*(HalBufs *)((long)hal + 0x70) != (HalBufs)0x0) {
    hal_bufs_deinit(*(HalBufs *)((long)hal + 0x70));
    *(undefined8 *)((long)hal + 0x70) = 0;
  }
  if (*(void **)((long)hal + 0x90) != (void *)0x0) {
    mpp_osal_free("vdpu34x_h264d_deinit",*(void **)((long)hal + 0x90));
  }
  *(undefined8 *)((long)hal + 0x90) = 0;
  return MPP_OK;
}

Assistant:

MPP_RET vdpu34x_h264d_deinit(void *hal)
{
    H264dHalCtx_t *p_hal = (H264dHalCtx_t *)hal;
    Vdpu34xH264dRegCtx *reg_ctx = (Vdpu34xH264dRegCtx *)p_hal->reg_ctx;

    RK_U32 i = 0;
    RK_U32 loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->reg_buf) : 1;

    mpp_buffer_put(reg_ctx->bufs);

    for (i = 0; i < loop; i++)
        MPP_FREE(reg_ctx->reg_buf[i].regs);

    loop = p_hal->fast_mode ? MPP_ARRAY_ELEMS(reg_ctx->rcb_buf) : 1;
    for (i = 0; i < loop; i++) {
        if (reg_ctx->rcb_buf[i]) {
            mpp_buffer_put(reg_ctx->rcb_buf[i]);
            reg_ctx->rcb_buf[i] = NULL;
        }
    }

    if (p_hal->cmv_bufs) {
        hal_bufs_deinit(p_hal->cmv_bufs);
        p_hal->cmv_bufs = NULL;
    }

    MPP_FREE(p_hal->reg_ctx);

    return MPP_OK;
}